

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.cpp
# Opt level: O2

void __thiscall
GdlLanguageDefn::AddFeatureValue
          (GdlLanguageDefn *this,GdlFeatureDefn *pfeat,GdlFeatureSetting *pfset,int nFset,
          GrpLineAndFile *lnf)

{
  pointer ppGVar1;
  ulong uVar2;
  ulong uVar3;
  allocator local_45;
  int local_44;
  GdlFeatureSetting *local_40;
  GdlFeatureDefn *local_38;
  string local_30;
  
  ppGVar1 = (this->m_vpfeat).super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    local_44 = nFset;
    local_40 = pfset;
    local_38 = pfeat;
    if ((ulong)((long)(this->m_vpfeat).
                      super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3) <= uVar3) {
      std::vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>::push_back
                (&this->m_vpfeat,&local_38);
      std::vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>::push_back
                (&this->m_vpfset,&local_40);
      std::vector<int,_std::allocator<int>_>::push_back(&this->m_vnFset,&local_44);
      return;
    }
    uVar2 = (ulong)((int)uVar3 + 1);
  } while (ppGVar1[uVar3] != pfeat);
  if ((this->m_vnFset).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[uVar3] != nFset) {
    std::__cxx11::string::string((string *)&local_30,"Duplicate language feature setting",&local_45)
    ;
    GrcErrorList::AddError(&g_errorList,0xc58,(GdlObject *)0x0,&local_30,lnf);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void GdlLanguageDefn::AddFeatureValue(GdlFeatureDefn * pfeat, GdlFeatureSetting * pfset,
	int nFset, GrpLineAndFile & lnf)
{
	for (auto ifeat = 0U; ifeat < m_vpfeat.size(); ++ifeat)
	{
		if (m_vpfeat[ifeat] == pfeat)
		{
			if (m_vnFset[ifeat] == nFset)
				return;
			else 
			{
				g_errorList.AddError(3160, NULL, "Duplicate language feature setting", lnf);
				return;
			}
		}
	}
	m_vpfeat.push_back(pfeat);
	m_vpfset.push_back(pfset);
	m_vnFset.push_back(nFset);
	Assert(m_vpfeat.size() == m_vpfset.size());
	Assert(m_vpfeat.size() == m_vnFset.size());
}